

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O3

void CoreMLConverter::convertCaffeMetadata
               (string *name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *bottom,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *top,RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *mappingDataBlobNames)

{
  size_t sVar1;
  pointer __s2;
  pointer pbVar2;
  uint uVar3;
  int iVar4;
  Type *this;
  iterator iVar5;
  key_type *pkVar6;
  Type *this_00;
  undefined8 *puVar7;
  long *plVar8;
  ostream *poVar9;
  Type *pTVar10;
  runtime_error *prVar11;
  uint uVar12;
  long *plVar13;
  ulong uVar14;
  uint uVar15;
  pointer pbVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  pointer pbVar17;
  uint uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_1;
  string *psVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputs;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  stringstream ss;
  long *local_278;
  undefined8 local_270;
  long local_268;
  undefined8 uStack_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  ulong *local_240;
  long local_238;
  ulong local_230 [2];
  ulong local_220;
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string *local_1d8;
  ulong local_1d0;
  RepeatedPtrFieldBase *local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  
  uVar15 = (nnWrite->super_RepeatedPtrFieldBase).current_size_;
  local_1d0 = (ulong)uVar15;
  uVar15 = uVar15 - 1;
  local_220 = (ulong)uVar15;
  local_1c8 = &nnWrite->super_RepeatedPtrFieldBase;
  local_1c0 = top;
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (&nnWrite->super_RepeatedPtrFieldBase,uVar15);
  psVar19 = (this->name_).ptr_;
  local_1d8 = name;
  if (psVar19 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,name);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar19);
  }
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  pbVar17 = (bottom->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar16 = (bottom->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar17 != pbVar16) {
    do {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&mappingDataBlobNames->_M_t,pbVar17);
      pkVar6 = pbVar17;
      if ((_Rb_tree_header *)iVar5._M_node !=
          &(mappingDataBlobNames->_M_t)._M_impl.super__Rb_tree_header) {
        pkVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](mappingDataBlobNames,pbVar17);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_258,pkVar6);
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar16);
  }
  pbVar17 = (local_1c0->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar16 = (local_1c0->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar17 != pbVar16) {
    do {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&mappingDataBlobNames->_M_t,pbVar17);
      pkVar6 = pbVar17;
      if ((_Rb_tree_header *)iVar5._M_node !=
          &(mappingDataBlobNames->_M_t)._M_impl.super__Rb_tree_header) {
        pkVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](mappingDataBlobNames,pbVar17);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1f8,pkVar6);
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar16);
  }
  pbVar16 = local_258.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar17 = local_258.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((((long)local_1f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        (long)local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) ||
      (sVar1 = (local_1f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,
      sVar1 != (local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)) ||
     ((sVar1 != 0 &&
      (iVar4 = bcmp(((local_1f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                    ((local_258.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,sVar1),
      iVar4 != 0)))) goto LAB_003cd386;
  if ((int)local_220 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "CoreML Specification requires unique input and output names for each layer. First layer of the caffe network cannot have identical input and output names."
               ,0x9a);
    std::endl<char,std::char_traits<char>>((ostream *)&local_1a8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)&local_278);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (local_1c8,(int)local_1d0 + -2);
  if ((this_00->output_).super_RepeatedPtrFieldBase.current_size_ != 1) {
LAB_003cd3da:
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Current layer\'s (\'",0x12);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,(local_1d8->_M_dataplus)._M_p,
                        local_1d8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\') input name (\'",0x10);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,((local_258.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (local_258.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\') does not match previous layer\'s (\'",0x25);
    psVar19 = (this_00->name_).ptr_;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,(psVar19->_M_dataplus)._M_p,psVar19->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\') output name (\'",0x11);
    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(this_00->output_).super_RepeatedPtrFieldBase,0);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(pTVar10->_M_dataplus)._M_p,pTVar10->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")\'",2);
    std::endl<char,std::char_traits<char>>(poVar9);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)&local_278);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar7 = (undefined8 *)((this_00->output_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  sVar1 = (local_258.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  if ((puVar7[1] != sVar1) ||
     ((__s2 = ((local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p, sVar1 != 0 &&
      (iVar4 = bcmp((void *)*puVar7,__s2,sVar1), iVar4 != 0)))) goto LAB_003cd3da;
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char*>((string *)&local_240,__s2,__s2 + sVar1);
  std::__cxx11::string::append((char *)&local_240);
  uVar18 = (uint)local_220;
  uVar15 = -uVar18;
  if (0 < (int)uVar18) {
    uVar15 = uVar18;
  }
  uVar18 = 1;
  if (9 < uVar15) {
    uVar14 = (ulong)uVar15;
    uVar3 = 4;
    do {
      uVar18 = uVar3;
      uVar12 = (uint)uVar14;
      if (uVar12 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_003cd191;
      }
      if (uVar12 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_003cd191;
      }
      if (uVar12 < 10000) goto LAB_003cd191;
      uVar14 = uVar14 / 10000;
      uVar3 = uVar18 + 4;
    } while (99999 < uVar12);
    uVar18 = uVar18 + 1;
  }
LAB_003cd191:
  uVar14 = local_220 >> 0x1f;
  local_218 = local_208;
  std::__cxx11::string::_M_construct
            ((ulong)&local_218,(char)uVar18 - ((char)(local_220 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((uVar14 & 1) + (long)local_218),uVar18,uVar15);
  uVar14 = 0xf;
  if (local_240 != local_230) {
    uVar14 = local_230[0];
  }
  if (uVar14 < (ulong)(local_210 + local_238)) {
    uVar14 = 0xf;
    if (local_218 != local_208) {
      uVar14 = local_208[0];
    }
    if (uVar14 < (ulong)(local_210 + local_238)) goto LAB_003cd212;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_240);
  }
  else {
LAB_003cd212:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_218);
  }
  local_278 = &local_268;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_268 = *plVar8;
    uStack_260 = puVar7[3];
  }
  else {
    local_268 = *plVar8;
    local_278 = (long *)*puVar7;
  }
  local_270 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_278,(ulong)(local_1d8->_M_dataplus)._M_p);
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_1a8 = *plVar13;
    lStack_1a0 = plVar8[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar13;
    local_1b8 = (long *)*plVar8;
  }
  local_1b0 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=
            ((string *)
             local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(string *)&local_1b8);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this_00->output_).super_RepeatedPtrFieldBase);
  CoreML::Specification::NeuralNetworkLayer::add_output
            (this_00,local_258.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  pbVar16 = local_258.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar17 = local_258.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
LAB_003cd386:
  for (; pbVar2 = local_1f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      psVar19 = local_1f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start, pbVar17 != pbVar16; pbVar17 = pbVar17 + 1
      ) {
    CoreML::Specification::NeuralNetworkLayer::add_input(this,pbVar17);
  }
  for (; psVar19 != pbVar2; psVar19 = psVar19 + 1) {
    CoreML::Specification::NeuralNetworkLayer::add_output(this,psVar19);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  return;
}

Assistant:

inline void convertCaffeMetadata(const std::string& name,
                                     const std::vector<std::string>& bottom,
                                     const std::vector<std::string>& top,
                                     ::google::protobuf::RepeatedPtrField< ::CoreML::Specification::NeuralNetworkLayer >* nnWrite,
                                     std::map<std::string, std::string>& mappingDataBlobNames) {
        
        int currentLayerNumber = nnWrite->size() - 1;
        CoreML::Specification::NeuralNetworkLayer* specLayer = nnWrite->Mutable(currentLayerNumber);
        
        //set name
        specLayer->set_name(name);
        
        //get inputs and outputs
        std::vector<std::string> inputs;
        std::vector<std::string> outputs;
        for (const auto& input: bottom) {
            if(mappingDataBlobNames.find(input) == mappingDataBlobNames.end()){
                inputs.push_back(input);
            } else {
                inputs.push_back(mappingDataBlobNames[input]);
            }
        }
        for (const auto& output: top) {
            if(mappingDataBlobNames.find(output) == mappingDataBlobNames.end()){
                outputs.push_back(output);
            } else {
                outputs.push_back(mappingDataBlobNames[output]);
            }
        }
        
        if (outputs.size() == inputs.size() == 1 && outputs[0]==inputs[0]) {
            if (currentLayerNumber == 0) {
                std::stringstream ss;
                ss << "CoreML Specification requires unique input and output names for each layer. First layer of the caffe network cannot have identical input and output names." << std::endl;
                throw std::runtime_error(ss.str());
            } else {
                CoreML::Specification::NeuralNetworkLayer* previousSpecLayer = nnWrite->Mutable(currentLayerNumber-1);
                if (previousSpecLayer->output_size()!=1 || previousSpecLayer->output(0)!=inputs[0]){
                    std::stringstream ss;
                    ss << "Current layer's ('" << name << "') input name ('" << inputs[0] << "') does not match previous layer's ('" ;
                    ss << previousSpecLayer->name() << "') output name ('" << previousSpecLayer->output(0) <<")'" << std::endl;
                    throw std::runtime_error(ss.str());
                } else {
                    inputs[0] = inputs[0] + "_" + std::to_string(currentLayerNumber) + name;
                    previousSpecLayer->clear_output();
                    previousSpecLayer->add_output(inputs[0]);
                }
            }
        }
        
        // set input names
        for (const auto& input: inputs) {
            specLayer->add_input(input);
        }
        
        //set output names
        for (const auto& output: outputs) {
            specLayer->add_output(output);
        }

    }